

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNet.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> * __thiscall
PyreNet::NeuralNet::predict
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,NeuralNet *this,
          vector<double,_std::allocator<double>_> *input)

{
  pointer pLVar1;
  undefined8 *puVar2;
  pointer_____offset_0x10___ *ppuVar3;
  Layer *l;
  pointer this_00;
  vector<double,_std::allocator<double>_> local_40;
  
  if (((this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
       super__Vector_impl_data._M_finish ==
       (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>._M_impl.
       super__Vector_impl_data._M_start) || (this->inputSize == 0)) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_0010cd20;
    ppuVar3 = &InvalidNetworkSize::typeinfo;
  }
  else {
    if ((long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start >> 3 == (long)this->inputSize) {
      std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,input);
      this_00 = (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pLVar1 = (this->layers).super__Vector_base<PyreNet::Layer,_std::allocator<PyreNet::Layer>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (this_00 != pLVar1) {
        do {
          Layer::calculate(&local_40,this_00,__return_storage_ptr__);
          std::vector<double,_std::allocator<double>_>::_M_move_assign
                    (__return_storage_ptr__,&local_40);
          if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_40.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_40.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          this_00 = this_00 + 1;
        } while (this_00 != pLVar1);
      }
      return __return_storage_ptr__;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_0010cca0;
    ppuVar3 = &InvalidInputSize::typeinfo;
  }
  __cxa_throw(puVar2,ppuVar3,std::exception::~exception);
}

Assistant:

std::vector<double> NeuralNet::predict(const std::vector<double> &input) {
        if (this->layers.size() == 0 || this->inputSize == 0) throw InvalidNetworkSize();
        if (input.size() != this->inputSize) throw InvalidInputSize();
        std::vector<double> layerData(input);
        for (Layer &l : this->layers) {
            layerData = l.calculate(layerData);
        }
        return layerData;
    }